

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

bool __thiscall TypeInfo::operator<(TypeInfo *this,TypeInfo *rhs)

{
  _Cat _Var1;
  __type_conflict _Var2;
  
  _Var1 = std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                    (&this->prefix,&rhs->prefix);
  if (_Var1._M_value < '\0') {
    return true;
  }
  _Var2 = std::operator==(&this->prefix,&rhs->prefix);
  if (_Var2) {
    _Var1 = std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                      (&this->type,&rhs->type);
    if (_Var1._M_value < '\0') {
      return true;
    }
    _Var2 = std::operator==(&this->type,&rhs->type);
    if (_Var2) {
      _Var1 = std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                        (&this->postfix,&rhs->postfix);
      return (bool)((byte)_Var1._M_value >> 7);
    }
  }
  return false;
}

Assistant:

bool operator<( TypeInfo const & rhs ) const noexcept
  {
    return ( prefix < rhs.prefix ) || ( ( prefix == rhs.prefix ) && ( ( type < rhs.type ) || ( ( type == rhs.type ) && ( postfix < rhs.postfix ) ) ) );
  }